

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O0

ssize_t __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::write
          (ManyToOneRingBuffer *this,int __fd,void *__buf,size_t __n)

{
  index_t iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  int in_R8D;
  index_t recordIndex;
  index_t requiredCapacity;
  index_t recordLength;
  bool isSuccessful;
  int32_t in_stack_00000064;
  index_t in_stack_000000cc;
  ManyToOneRingBuffer *in_stack_000000d0;
  AtomicBuffer *pAVar3;
  undefined4 in_stack_ffffffffffffffb0;
  index_t iVar4;
  undefined8 in_stack_ffffffffffffffb8;
  index_t iVar5;
  AtomicBuffer *in_stack_ffffffffffffffc0;
  
  iVar5 = (index_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  iVar1 = (index_t)__n;
  RecordDescriptor::checkMsgTypeId(in_stack_00000064);
  checkMsgLength(in_stack_000000d0,in_stack_000000cc);
  util::BitUtil::align<int>(in_R8D + 8,8);
  iVar1 = claimCapacity((ManyToOneRingBuffer *)__buf,iVar1);
  uVar2 = 0xfffffffe;
  if (iVar1 != -2) {
    pAVar3 = this->m_buffer;
    iVar4 = iVar1;
    RecordDescriptor::makeHeader(-(in_R8D + 8),__fd);
    AtomicBuffer::putInt64Ordered
              (in_stack_ffffffffffffffc0,iVar5,CONCAT44(iVar4,in_stack_ffffffffffffffb0));
    iVar5 = (index_t)((ulong)this->m_buffer >> 0x20);
    RecordDescriptor::encodedMsgOffset(iVar1);
    AtomicBuffer::putBytes
              (in_stack_ffffffffffffffc0,iVar5,
               (AtomicBuffer *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
               (index_t)((ulong)pAVar3 >> 0x20),(index_t)pAVar3);
    RecordDescriptor::lengthOffset(iVar1);
    AtomicBuffer::putInt32Ordered
              ((AtomicBuffer *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
               (index_t)((ulong)pAVar3 >> 0x20),(int32_t)pAVar3);
    uVar2 = extraout_RAX;
  }
  return CONCAT71((int7)((ulong)uVar2 >> 8),iVar1 != -2);
}

Assistant:

bool write(
        std::int32_t msgTypeId, concurrent::AtomicBuffer& srcBuffer, util::index_t srcIndex, util::index_t length)
    {
        bool isSuccessful = false;

        RecordDescriptor::checkMsgTypeId(msgTypeId);
        checkMsgLength(length);

        const util::index_t recordLength = length + RecordDescriptor::HEADER_LENGTH;
        const util::index_t requiredCapacity = util::BitUtil::align(recordLength, RecordDescriptor::ALIGNMENT);
        const util::index_t recordIndex = claimCapacity(requiredCapacity);

        if (INSUFFICIENT_CAPACITY != recordIndex)
        {
            m_buffer.putInt64Ordered(recordIndex, RecordDescriptor::makeHeader(-recordLength, msgTypeId));
            m_buffer.putBytes(RecordDescriptor::encodedMsgOffset(recordIndex), srcBuffer, srcIndex, length);
            m_buffer.putInt32Ordered(RecordDescriptor::lengthOffset(recordIndex), recordLength);

            isSuccessful = true;
        }

        return isSuccessful;
    }